

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O0

node_t * __thiscall
expression_tree::node<int,_expression_tree::cache_on_evaluation,_expression_tree::sequential>::
operator=(node<int,_expression_tree::cache_on_evaluation,_expression_tree::sequential> *this,
         node_t *other)

{
  pointer pnVar1;
  long lVar2;
  long *local_40;
  branch *p;
  node_t *local_18;
  node_t *other_local;
  node<int,_expression_tree::cache_on_evaluation,_expression_tree::sequential> *this_local;
  
  if (this != other) {
    local_18 = other;
    other_local = this;
    pnVar1 = std::
             unique_ptr<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
             ::operator->(&other->impl);
    (*pnVar1->_vptr_node_impl[2])(&p);
    std::
    unique_ptr<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
    ::operator=(&this->impl,
                (unique_ptr<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
                 *)&p);
    std::
    unique_ptr<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
    ::~unique_ptr((unique_ptr<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
                   *)&p);
    pnVar1 = std::
             unique_ptr<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
             ::get(&this->impl);
    if (pnVar1 == (pointer)0x0) {
      local_40 = (long *)0x0;
    }
    else {
      local_40 = (long *)__dynamic_cast(pnVar1,&detail::node_impl<int>::typeinfo,
                                        &cache_on_evaluation<int,expression_tree::sequential>::
                                         branch::typeinfo,0);
    }
    if (local_40 != (long *)0x0) {
      lVar2 = (**(code **)(*local_40 + 0x38))();
      *(node<int,_expression_tree::cache_on_evaluation,_expression_tree::sequential> **)
       (lVar2 + 0x10) = this;
      lVar2 = (**(code **)(*local_40 + 0x28))();
      *(node<int,_expression_tree::cache_on_evaluation,_expression_tree::sequential> **)
       (lVar2 + 0x10) = this;
    }
    if (this->parent != (node_t *)0x0) {
      modified(this->parent);
    }
  }
  return this;
}

Assistant:

node_t& operator=(const node_t& other)
	{
		if(this != &other)
		{
			impl = other.impl->clone();
			if(auto p = dynamic_cast<typename CachingPolicy<T, ThreadingPolicy>::branch*>(impl.get()))
			{
				p->left().parent = p->right().parent = this;
			}

			if(parent)
			{
				parent->modified();
			}
		}

		return *this;
	}